

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O3

void __thiscall Clasp::Cli::ClaspAppBase::run(ClaspAppBase *this,ClaspFacade *clasp)

{
  char cVar1;
  bool bVar2;
  istream *str;
  ssize_t sVar3;
  size_t in_RCX;
  void *__buf;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf_00;
  int __fd;
  ClaspFacade *pCVar4;
  ProgramBuilder *prg;
  PrgDepGraph *graph;
  LitVec local_28;
  
  str = getStream(this,false);
  ClaspFacade::start(clasp,&(this->claspConfig_).super_ClaspConfig,str);
  pCVar4 = clasp;
  handleStartOptions(this,clasp);
  sVar3 = ClaspFacade::read(clasp,(int)pCVar4,__buf,in_RCX);
  cVar1 = (char)sVar3;
  while (cVar1 != '\0') {
    prg = (ProgramBuilder *)((clasp->builder_).ptr_ & 0xfffffffffffffffe);
    bVar2 = handlePostGroundOptions(this,prg);
    __fd = (int)prg;
    __buf_00 = extraout_RDX;
    if (bVar2) {
      ClaspFacade::prepare(clasp,enum_volatile);
      if (((this->claspAppOpts_).hccOut._M_string_length != 0) &&
         (graph = (PrgDepGraph *)((clasp->ctx).sccGraph.ptr_ & 0xfffffffffffffffe),
         graph != (PrgDepGraph *)0x0)) {
        writeNonHcfs(this,graph);
      }
      local_28.ebo_.buf = (pointer)0x0;
      local_28.ebo_.size = 0;
      local_28.ebo_.cap = 0;
      __fd = (int)&local_28;
      ClaspFacade::solve(clasp,&local_28,(EventHandler *)0x0);
      __buf_00 = extraout_RDX_00;
      if (local_28.ebo_.buf != (pointer)0x0) {
        operator_delete(local_28.ebo_.buf);
        __buf_00 = extraout_RDX_01;
      }
    }
    sVar3 = ClaspFacade::read(clasp,__fd,__buf_00,in_RCX);
    cVar1 = (char)sVar3;
  }
  return;
}

Assistant:

void ClaspAppBase::run(ClaspFacade& clasp) {
	clasp.start(claspConfig_, getStream());
	handleStartOptions(clasp);
	while (clasp.read()) {
		if (handlePostGroundOptions(*clasp.program())) {
			clasp.prepare();
			if (handlePreSolveOptions(clasp)) { clasp.solve(); }
		}
	}
}